

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  float fVar3;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  pIVar1->FontWindowScale = scale;
  fVar3 = scale * pIVar1->Ctx->FontBaseSize;
  if (pIVar1->ParentWindow != (ImGuiWindow *)0x0) {
    fVar3 = fVar3 * pIVar1->ParentWindow->FontWindowScale;
  }
  (pIVar2->DrawListSharedData).FontSize = fVar3;
  pIVar2->FontSize = fVar3;
  fVar3 = fVar3 / pIVar2->Font->FontSize;
  (pIVar2->DrawListSharedData).FontScale = fVar3;
  pIVar2->FontScale = fVar3;
  return;
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
    g.FontScale = g.DrawListSharedData.FontScale = g.FontSize / g.Font->FontSize;
}